

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,double>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<duckdb::hugeint_t,_double> *source,
               ArgMinMaxState<duckdb::hugeint_t,_double> *target,AggregateInputData *param_3)

{
  int64_t iVar1;
  bool bVar2;
  
  if (((source->super_ArgMinMaxStateBase).is_initialized == true) &&
     (((target->super_ArgMinMaxStateBase).is_initialized != true ||
      (bVar2 = duckdb::GreaterThan::Operation<double>(&target->value,&source->value), bVar2)))) {
    bVar2 = (source->super_ArgMinMaxStateBase).arg_null;
    (target->super_ArgMinMaxStateBase).arg_null = bVar2;
    if (bVar2 == false) {
      iVar1 = (source->arg).upper;
      (target->arg).lower = (source->arg).lower;
      (target->arg).upper = iVar1;
    }
    target->value = source->value;
    (target->super_ArgMinMaxStateBase).is_initialized = true;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}